

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

void parse_fd_array(CID_Face face,CID_Parser *parser)

{
  FT_Memory memory;
  FT_Stream pFVar1;
  uint in_EAX;
  ulong uVar2;
  CID_FaceDict pCVar3;
  FT_Fixed *pFVar4;
  ulong new_count;
  FT_Error error;
  undefined8 uStack_28;
  
  memory = (face->root).memory;
  pFVar1 = parser->stream;
  uStack_28 = (ulong)in_EAX;
  uVar2 = (*(parser->root).funcs.to_int)(&parser->root);
  if (uVar2 < 0x80000000) {
    new_count = pFVar1->size / 100;
    if ((long)uVar2 < (long)new_count) {
      new_count = uVar2;
    }
    if ((face->cid).font_dicts == (CID_FaceDict)0x0) {
      pCVar3 = (CID_FaceDict)
               ft_mem_realloc(memory,0x150,0,new_count,(void *)0x0,
                              (FT_Error *)((long)&uStack_28 + 4));
      (face->cid).font_dicts = pCVar3;
      if ((uStack_28._4_4_ == 0) && ((face->cid).num_dicts = (FT_UInt)new_count, new_count != 0)) {
        pFVar4 = &(pCVar3->private_dict).expansion_factor;
        do {
          pFVar4[-9] = 0x100000007;
          *(FT_Int *)((long)pFVar4 + -0xbc) = 4;
          *pFVar4 = 0xf5c;
          pFVar4[-10] = 0x27a000;
          pFVar4 = pFVar4 + 0x2a;
          new_count = new_count - 1;
        } while (new_count != 0);
      }
    }
  }
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  parse_fd_array( CID_Face     face,
                  CID_Parser*  parser )
  {
    CID_FaceInfo  cid    = &face->cid;
    FT_Memory     memory = face->root.memory;
    FT_Stream     stream = parser->stream;
    FT_Error      error  = FT_Err_Ok;
    FT_Long       num_dicts, max_dicts;


    num_dicts = cid_parser_to_int( parser );
    if ( num_dicts < 0 || num_dicts > FT_INT_MAX )
    {
      FT_ERROR(( "parse_fd_array: invalid number of dictionaries\n" ));
      goto Exit;
    }

    FT_TRACE4(( " %ld\n", num_dicts ));

    /*
     * A single entry in the FDArray must (at least) contain the following
     * structure elements.
     *
     *   %ADOBeginFontDict              18
     *   X dict begin                   13
     *     /FontMatrix [X X X X]        22
     *     /Private X dict begin        22
     *     end                           4
     *   end                             4
     *   %ADOEndFontDict                16
     *
     * This needs 18+13+22+22+4+4+16=99 bytes or more.  Normally, you also
     * need a `dup X' at the very beginning and a `put' at the end, so a
     * rough guess using 100 bytes as the minimum is justified.
     */
    max_dicts = (FT_Long)( stream->size / 100 );
    if ( num_dicts > max_dicts )
    {
      FT_TRACE0(( "parse_fd_array: adjusting FDArray size"
                  " (from %ld to %ld)\n",
                  num_dicts, max_dicts ));
      num_dicts = max_dicts;
    }

    if ( !cid->font_dicts )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( cid->font_dicts, num_dicts ) )
        goto Exit;

      cid->num_dicts = num_dicts;

      /* set some default values (the same as for Type 1 fonts) */
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_FaceDict  dict = cid->font_dicts + n;


        dict->private_dict.blue_shift       = 7;
        dict->private_dict.blue_fuzz        = 1;
        dict->private_dict.lenIV            = 4;
        dict->private_dict.expansion_factor = (FT_Fixed)( 0.06 * 0x10000L );
        dict->private_dict.blue_scale       = (FT_Fixed)(
                                                0.039625 * 0x10000L * 1000 );
      }
    }

  Exit:
    return;
  }